

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpixmap.cpp
# Opt level: O2

void __thiscall QPixmap::QPixmap(QPixmap *this,char **xpm)

{
  QPlatformPixmap *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QPixmap local_60;
  undefined1 local_48 [16];
  QImageData *local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  QPaintDevice::QPaintDevice(&this->super_QPaintDevice);
  (this->super_QPaintDevice)._vptr_QPaintDevice = (_func_int **)&PTR__QPixmap_0077be48;
  (this->data).d.ptr = (QPlatformPixmap *)0x0;
  QExplicitlySharedDataPointer<QPlatformPixmap>::reset(&this->data,(QPlatformPixmap *)0x0);
  if (xpm != (char **)0x0) {
    local_38 = (QImageData *)&DAT_aaaaaaaaaaaaaaaa;
    local_48._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_48._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QImage::QImage((QImage *)local_48,xpm);
    bVar2 = QImage::isNull((QImage *)local_48);
    if (!bVar2) {
      pQVar1 = (this->data).d.ptr;
      if ((pQVar1 == (QPlatformPixmap *)0x0) || (pQVar1->type != BitmapType)) {
        fromImageInPlace(&local_60,(QImage *)local_48,(ImageConversionFlags)0x0);
        operator=(this,&local_60);
        ~QPixmap(&local_60);
      }
      else {
        QBitmap::fromImage((QBitmap *)&local_60,(QImage *)local_48,(ImageConversionFlags)0x0);
        operator=(this,&local_60);
        QBitmap::~QBitmap((QBitmap *)&local_60);
      }
    }
    QImage::~QImage((QImage *)local_48);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPixmap::QPixmap(const char * const xpm[])
    : QPaintDevice()
{
    doInit(0, 0, QPlatformPixmap::PixmapType);
    if (!xpm)
        return;

    QImage image(xpm);
    if (!image.isNull()) {
        if (data && data->pixelType() == QPlatformPixmap::BitmapType)
            *this = QBitmap::fromImage(std::move(image));
        else
            *this = fromImage(std::move(image));
    }
}